

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void fixupL(int n,int *perm_r,GlobalLU_t *Glu)

{
  uint uVar1;
  int iVar2;
  int_t *piVar3;
  int *piVar4;
  int_t *piVar5;
  long lVar6;
  long lVar7;
  int_t iVar8;
  long lVar9;
  long lVar10;
  
  if (1 < n) {
    piVar3 = Glu->xlsub;
    uVar1 = Glu->supno[(uint)n];
    if ((int)uVar1 < 0) {
      iVar8 = 0;
    }
    else {
      piVar4 = Glu->xsup;
      piVar5 = Glu->lsub;
      lVar9 = 0;
      lVar6 = 0;
      do {
        lVar10 = (long)piVar4[lVar6];
        iVar2 = piVar3[lVar10];
        lVar7 = (long)iVar2;
        piVar3[lVar10] = (int)lVar9;
        if (iVar2 < piVar3[lVar10 + 1]) {
          lVar9 = (long)(int)lVar9;
          do {
            piVar5[lVar9] = perm_r[piVar5[lVar7]];
            lVar9 = lVar9 + 1;
            lVar7 = lVar7 + 1;
          } while (lVar7 < piVar3[lVar10 + 1]);
        }
        iVar8 = (int_t)lVar9;
        lVar10 = lVar10 + 1;
        lVar7 = lVar6 + 1;
        if ((int)lVar10 < piVar4[lVar6 + 1]) {
          do {
            piVar3[lVar10] = iVar8;
            lVar10 = lVar10 + 1;
          } while (lVar10 < piVar4[lVar7]);
        }
        lVar6 = lVar7;
      } while (lVar7 != (ulong)uVar1 + 1);
    }
    piVar3[(uint)n] = iVar8;
  }
  return;
}

Assistant:

void
fixupL(const int n, const int *perm_r, GlobalLU_t *Glu)
{
    int nsuper, fsupc, i, k;
    int_t nextl, j, jstrt;
    int   *xsup;
    int_t *lsub, *xlsub;

    if ( n <= 1 ) return;

    xsup   = Glu->xsup;
    lsub   = Glu->lsub;
    xlsub  = Glu->xlsub;
    nextl  = 0;
    nsuper = (Glu->supno)[n];
    
    /* 
     * For each supernode ...
     */
    for (i = 0; i <= nsuper; i++) {
	fsupc = xsup[i];
	jstrt = xlsub[fsupc];
	xlsub[fsupc] = nextl;
	for (j = jstrt; j < xlsub[fsupc+1]; j++) {
	    lsub[nextl] = perm_r[lsub[j]]; /* Now indexed into P*A */
	    nextl++;
  	}
	for (k = fsupc+1; k < xsup[i+1]; k++) 
	    	xlsub[k] = nextl;	/* Other columns in supernode i */

    }

    xlsub[n] = nextl;
}